

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelper_TextFormatDecodeData_ByteCodes_Test::~ObjCHelper_TextFormatDecodeData_ByteCodes_Test
          (ObjCHelper_TextFormatDecodeData_ByteCodes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, TextFormatDecodeData_ByteCodes) {
  TextFormatDecodeData decode_data;

  decode_data.AddString(1, "abcdefghIJ", "abcdefghIJ");
  decode_data.AddString(3, "abcdefghIJ", "_AbcdefghIJ");
  decode_data.AddString(2, "abcdefghIJ", "Abcd_EfghIJ");
  decode_data.AddString(4, "abcdefghIJ", "ABCD__EfghI_j");
  decode_data.AddString(1000,
                        "longFieldNameIsLoooooooooooooooooooooooooooooooooooooo"
                        "ooooooooooooooooooooooooooooooooooong1000",
                        "long_field_name_is_"
                        "looooooooooooooooooooooooooooooooooooooooooooooooooooo"
                        "oooooooooooooooooooong_1000");

  EXPECT_EQ(5, decode_data.num_entries());

  // clang-format off
  uint8_t expected_data[] = {
      0x5,
      // All as is (00 op)
      0x1,  0x0A, 0x0,
      // Underscore, upper + 9 (10 op)
      0x3,  0xCA, 0x0,
      //  Upper + 3 (10 op), underscore, upper + 5 (10 op)
      0x2,  0x44, 0xC6, 0x0,
      // All Upper for 4 (11 op), underscore, underscore, upper + 5 (10 op),
      // underscore, lower + 0 (01 op)
      0x4,  0x64, 0x80, 0xC5, 0xA1, 0x0,
      // 2 byte key: as is + 3 (00 op), underscore, lower + 4 (01 op),
      //   underscore, lower + 3 (01 op), underscore, lower + 1 (01 op),
      //   underscore, lower + 30 (01 op), as is + 30 (00 op), as is + 13 (00
      //   op),
      //   underscore, as is + 3 (00 op)
      0xE8, 0x07, 0x04, 0xA5, 0xA4, 0xA2, 0xBF, 0x1F, 0x0E, 0x84, 0x0,
  };
  // clang-format on
  std::string expected((const char*)expected_data, sizeof(expected_data));

  EXPECT_EQ(expected, decode_data.Data());
}